

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

Layer * __thiscall tinyusdz::Layer::operator=(Layer *this,Layer *param_1)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Layer *param_1_local;
  Layer *this_local;
  
  ::std::__cxx11::string::operator=((string *)this,(string *)param_1);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  ::operator=(&this->_prim_specs,&param_1->_prim_specs);
  LayerMetas::operator=(&this->_metas,&param_1->_metas);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  ::operator=(&this->_primspec_path_cache,&param_1->_primspec_path_cache);
  bVar1 = param_1->_has_unresolved_references;
  bVar2 = param_1->_has_unresolved_payload;
  bVar3 = param_1->_has_unresolved_variant;
  bVar4 = param_1->_has_unresolved_inherits;
  bVar5 = param_1->_has_unresolved_specializes;
  bVar6 = param_1->_has_over_primspec;
  bVar7 = param_1->_has_class_primspec;
  this->_dirty = param_1->_dirty;
  this->_has_unresolved_references = bVar1;
  this->_has_unresolved_payload = bVar2;
  this->_has_unresolved_variant = bVar3;
  this->_has_unresolved_inherits = bVar4;
  this->_has_unresolved_specializes = bVar5;
  this->_has_over_primspec = bVar6;
  this->_has_class_primspec = bVar7;
  ::std::__cxx11::string::operator=
            ((string *)&this->_current_working_path,(string *)&param_1->_current_working_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->_asset_search_paths,&param_1->_asset_search_paths);
  this->_asset_resolution_userdata = param_1->_asset_resolution_userdata;
  return this;
}

Assistant:

const std::string name() const { return _name; }